

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceOuterBound::~IfcFaceOuterBound(IfcFaceOuterBound *this)

{
  IfcFaceBound::~IfcFaceBound(&this->super_IfcFaceBound,&PTR_construction_vtable_24__007c9760);
  return;
}

Assistant:

IfcFaceOuterBound() : Object("IfcFaceOuterBound") {}